

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::~RuleBasedBreakIterator(RuleBasedBreakIterator *this)

{
  CharacterIterator *pCVar1;
  DictionaryCache *this_00;
  void *in_RSI;
  
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_0047d7a0;
  pCVar1 = this->fCharIter;
  if (pCVar1 != (CharacterIterator *)0x0 && (StringCharacterIterator *)pCVar1 != &this->fSCharIter)
  {
    (*(pCVar1->super_ForwardCharacterIterator).super_UObject._vptr_UObject[1])();
  }
  this->fCharIter = (CharacterIterator *)0x0;
  utext_close_63(&this->fText);
  if (this->fData != (RBBIDataWrapper *)0x0) {
    RBBIDataWrapper::removeReference(this->fData);
    this->fData = (RBBIDataWrapper *)0x0;
  }
  if (this->fBreakCache != (BreakCache *)0x0) {
    (*this->fBreakCache->_vptr_BreakCache[1])();
  }
  this->fBreakCache = (BreakCache *)0x0;
  this_00 = this->fDictionaryCache;
  if (this_00 != (DictionaryCache *)0x0) {
    DictionaryCache::~DictionaryCache(this_00);
  }
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  this->fDictionaryCache = (DictionaryCache *)0x0;
  if (this->fLanguageBreakEngines != (UStack *)0x0) {
    (*(this->fLanguageBreakEngines->super_UVector).super_UObject._vptr_UObject[1])();
  }
  this->fLanguageBreakEngines = (UStack *)0x0;
  if (this->fUnhandledBreakEngine != (UnhandledEngine *)0x0) {
    (*(this->fUnhandledBreakEngine->super_LanguageBreakEngine)._vptr_LanguageBreakEngine[1])();
  }
  this->fUnhandledBreakEngine = (UnhandledEngine *)0x0;
  StringCharacterIterator::~StringCharacterIterator(&this->fSCharIter);
  BreakIterator::~BreakIterator(&this->super_BreakIterator);
  return;
}

Assistant:

RuleBasedBreakIterator::~RuleBasedBreakIterator() {
    if (fCharIter != &fSCharIter) {
        // fCharIter was adopted from the outside.
        delete fCharIter;
    }
    fCharIter = NULL;

    utext_close(&fText);

    if (fData != NULL) {
        fData->removeReference();
        fData = NULL;
    }
    delete fBreakCache;
    fBreakCache = NULL;

    delete fDictionaryCache;
    fDictionaryCache = NULL;

    delete fLanguageBreakEngines;
    fLanguageBreakEngines = NULL;

    delete fUnhandledBreakEngine;
    fUnhandledBreakEngine = NULL;
}